

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

string * __thiscall
cmInstallCommand::GetInfoDestination_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallCommand *this,cmInstallCommandArguments *args)

{
  allocator<char> local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_INSTALL_INFODIR",&local_79);
  GetDataRootDestination_abi_cxx11_(&local_78,this,(cmInstallCommandArguments *)0x0);
  std::operator+(&local_58,&local_78,"/info");
  GetDestination(__return_storage_ptr__,this,args,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCommand::GetInfoDestination(
  const cmInstallCommandArguments* args)
{
  return this->GetDestination(args, "CMAKE_INSTALL_INFODIR",
                              this->GetDataRootDestination(nullptr) + "/info");
}